

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

void __thiscall r_exec::_TPX::inject_hlps(_TPX *this)

{
  _Mem *this_00;
  pointer pPVar1;
  
  pPVar1 = (this->csts).
           super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pPVar1 != (this->csts).
                super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = (_Mem *)r_code::Mem::Get();
      _Mem::pack_hlp(this_00,(Code *)pPVar1->object);
      pPVar1 = pPVar1 + 1;
    } while (pPVar1 != (this->csts).
                       super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  AutoFocusController::inject_hlps((this->super_TPX).auto_focus,&this->csts);
  AutoFocusController::inject_hlps((this->super_TPX).auto_focus,&this->mdls);
  return;
}

Assistant:

void _TPX::inject_hlps() const
{
    std::vector<P<Code> >::const_iterator c;

    for (c = csts.begin(); c != csts.end(); ++c) {
        _Mem::Get()->pack_hlp(*c);
    }

    auto_focus->inject_hlps(csts);
    auto_focus->inject_hlps(mdls);
}